

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::SingleFailureChecker::~SingleFailureChecker(SingleFailureChecker *this)

{
  Type TVar1;
  TestPartResultArray *this_00;
  TestPartResult *pTVar2;
  AssertionResult *pAVar3;
  string *value;
  char *pcVar4;
  int i;
  int index;
  undefined1 local_78 [8];
  string expected;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  Message msg;
  
  this_00 = this->results_;
  TVar1 = this->type_;
  pcVar4 = "1 non-fatal failure";
  if (TVar1 == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_78,pcVar4,(allocator<char> *)&gtest_ar.message_);
  Message::Message((Message *)&local_38);
  value = &this->substr_;
  if ((int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70) == 1) {
    pTVar2 = TestPartResultArray::GetTestPartResult(this_00,0);
    if (pTVar2->type_ == TVar1) {
      pcVar4 = strstr((pTVar2->message_)._M_dataplus._M_p,(value->_M_dataplus)._M_p);
      if (pcVar4 != (char *)0x0) {
        expected.field_2._M_local_buf[8] = '\x01';
        gtest_ar.success_ = false;
        gtest_ar._1_7_ = 0;
        goto LAB_0015add0;
      }
      gtest_ar.message_.ptr_._0_1_ = 0;
      local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<
                         ((AssertionResult *)&gtest_ar.message_,(char (*) [11])0x177ddf);
      pAVar3 = AssertionResult::operator<<
                         (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,value);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x1787ad);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar3);
    }
    else {
      gtest_ar.message_.ptr_._0_1_ = 0;
      local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<
                         ((AssertionResult *)&gtest_ar.message_,(char (*) [11])0x177ddf);
      pAVar3 = AssertionResult::operator<<
                         (pAVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_78);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x178482);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar2);
      AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar3);
    }
  }
  else {
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),"Expected: ");
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),(string *)local_78);
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),"\n");
    std::operator<<((ostream *)(local_38.ptr_ + 0x10),"  Actual: ");
    std::ostream::operator<<
              (local_38.ptr_ + 0x10,(int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70));
    std::operator<<((ostream *)(local_38.ptr_ + 0x10)," failures");
    for (index = 0; index < (int)((*(long *)(this_00 + 8) - *(long *)this_00) / 0x70);
        index = index + 1) {
      std::operator<<((ostream *)(local_38.ptr_ + 0x10),"\n");
      pTVar2 = TestPartResultArray::GetTestPartResult(this_00,index);
      testing::operator<<((ostream *)(local_38.ptr_ + 0x10),pTVar2);
    }
    gtest_ar.message_.ptr_._0_1_ = 0;
    local_40.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<((AssertionResult *)&gtest_ar.message_,(Message *)&local_38)
    ;
    AssertionResult::AssertionResult((AssertionResult *)((long)&expected.field_2 + 8),pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_40);
LAB_0015add0:
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_38);
  std::__cxx11::string::~string((string *)local_78);
  if (expected.field_2._M_local_buf[8] == '\0') {
    Message::Message((Message *)local_78);
    if (gtest_ar._0_8_ == 0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar._0_8_;
    }
    AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/tests/gtest/googletest/src/gtest.cc"
               ,0x2c7,pcVar4);
    AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,(Message *)local_78);
    AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&gtest_ar);
  std::__cxx11::string::~string((string *)value);
  return;
}

Assistant:

SingleFailureChecker::~SingleFailureChecker() {
  EXPECT_PRED_FORMAT3(HasOneFailure, *results_, type_, substr_);
}